

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_circuit.cpp
# Opt level: O3

void __thiscall lsim::ModelCircuit::disconnect_component(ModelCircuit *this,uint32_t id)

{
  _Hash_node_base *p_Var1;
  
  for (p_Var1 = (this->m_wires)._M_h._M_before_begin._M_nxt; p_Var1 != (_Hash_node_base *)0x0;
      p_Var1 = p_Var1->_M_nxt) {
    ModelWire::remove_component_pins((ModelWire *)p_Var1[2]._M_nxt,id);
  }
  return;
}

Assistant:

void ModelCircuit::disconnect_component(uint32_t id) {
    for (auto &pair : m_wires) {
        pair.second->remove_component_pins(id);
    }
}